

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O1

void lddmc_sha2_rec(MDD mdd,SHA256_CTX *ctx)

{
  uint8_t *puVar1;
  long lVar2;
  uint32_t val;
  MDD local_28;
  undefined4 local_1c;
  
  local_28 = mdd;
  if (mdd < 2) {
    SHA256_Update((SHA256_CTX *)ctx,&local_28,8);
  }
  else {
    puVar1 = nodes->data;
    lVar2 = mdd * 0x10;
    if ((*(ulong *)(puVar1 + lVar2) & 1) == 0) {
      *(ulong *)(puVar1 + lVar2) = *(ulong *)(puVar1 + lVar2) | 1;
      local_1c = *(undefined4 *)(puVar1 + lVar2 + 6);
      SHA256_Update((SHA256_CTX *)ctx,&local_1c,4);
      lddmc_sha2_rec(*(ulong *)(puVar1 + lVar2 + 8) >> 0x11,ctx);
      lddmc_sha2_rec(*(ulong *)(puVar1 + lVar2) >> 1 & 0x7fffffffffff,ctx);
    }
  }
  return;
}

Assistant:

static void
lddmc_sha2_rec(MDD mdd, SHA256_CTX *ctx)
{
    if (mdd <= lddmc_true) {
        SHA256_Update(ctx, (void*)&mdd, sizeof(uint64_t));
        return;
    }

    mddnode_t node = LDD_GETNODE(mdd);
    if (lddmc_mark(node)) {
        uint32_t val = mddnode_getvalue(node);
        SHA256_Update(ctx, (void*)&val, sizeof(uint32_t));
        lddmc_sha2_rec(mddnode_getdown(node), ctx);
        lddmc_sha2_rec(mddnode_getright(node), ctx);
    }
}